

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall
opengv::relative_pose::modules::Ge_step::operator()(Ge_step *this,VectorXd *x,VectorXd *fvec)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  Matrix3d *unaff_RBX;
  Matrix3d *in_RDI;
  Matrix3d *unaff_R12;
  Matrix3d *unaff_R13;
  Matrix3d *unaff_R14;
  Matrix3d *unaff_R15;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000030;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000038;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000040;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000048;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000050;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000058;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00000060;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00000068;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00000070;
  cayley_t *in_stack_00000078;
  Matrix<double,_1,_3,_1,_1,_3> *in_stack_00000080;
  int in_stack_00000088;
  Matrix<double,_1,_3,_1,_1,_3> jacobian;
  cayley_t cayley;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffee8;
  double row;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffef0;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *this_00;
  Matrix3d *zxF;
  
  zxF = in_RDI;
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)0xe2fcc8);
  row = (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
        array[7];
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
            (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
  ge::getCostWithJacobian
            (unaff_R15,unaff_R14,unaff_R13,unaff_R12,unaff_RBX,zxF,in_stack_00000030,
             in_stack_00000038,in_stack_00000040,in_stack_00000048,in_stack_00000050,
             in_stack_00000058,in_stack_00000060,in_stack_00000068,in_stack_00000070,
             in_stack_00000078,in_stack_00000080,in_stack_00000088);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                     (this_00,(Index)row,0xe2fd94);
  SVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                      (Index)row);
  *pSVar3 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                     (this_00,(Index)row,0xe2fdd5);
  SVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                      (Index)row);
  *pSVar3 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                     (this_00,(Index)row,0xe2fe17);
  SVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                      (Index)row);
  *pSVar3 = SVar1;
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
  {
    cayley_t cayley = x;
    Eigen::Matrix<double,1,3> jacobian;
    ge::getCostWithJacobian(
        _xxF,_yyF,_zzF,_xyF,_yzF,_zxF,
        _x1P,_y1P,_z1P,_x2P,_y2P,_z2P,_m11P,_m12P,_m22P,cayley,jacobian,1);

    fvec[0] = jacobian(0,0);
    fvec[1] = jacobian(0,1);
    fvec[2] = jacobian(0,2);
    
    return 0;
  }